

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void MAFSA_automaton_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_automaton_string_handler fetcher)

{
  MAFSA_automaton in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  MAFSA_stack_struct *in_R9;
  MAFSA_letter label;
  MAFSA_stack_struct tmp_stack;
  uint32_t where;
  uint32_t current;
  uint32_t i;
  MAFSA_letter in_stack_ffffffffffffffa3;
  uint32_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t uVar1;
  undefined4 uVar2;
  uint uVar3;
  uint32_t cstate;
  MAFSA_automaton ma_00;
  
  uVar2 = *(undefined4 *)*in_RDI;
  uVar1 = 1;
  ma_00 = in_RCX;
  for (uVar3 = 0; cstate = (uint32_t)((ulong)in_R8 >> 0x20), uVar3 < in_RDX; uVar3 = uVar3 + 1) {
    in_stack_ffffffffffffffa4 =
         CONCAT13(*(MAFSA_letter *)(in_RSI + (ulong)uVar3),(int3)in_stack_ffffffffffffffa4);
    stack_push((MAFSA_stack_struct *)&stack0xffffffffffffffa8,
               *(MAFSA_letter *)(in_RSI + (ulong)uVar3));
    uVar1 = MAFSA_delta((uint32_t *)in_RCX,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa3);
    cstate = (uint32_t)((ulong)in_R8 >> 0x20);
    if (uVar1 == 0) break;
    uVar2 = *(undefined4 *)(*in_RDI + (ulong)uVar1 * 4);
  }
  if (((uVar3 == in_RDX) && (uVar1 != 0)) || (in_RSI == 0)) {
    enumerate(ma_00,cstate,in_R9,(MAFSA_automaton_string_handler)CONCAT44(uVar3,uVar2),
              (void *)CONCAT44(uVar1,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

extern void MAFSA_automaton_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_automaton_string_handler fetcher)
{
    uint32_t i;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 1;

    struct MAFSA_stack_struct tmp_stack;

    tmp_stack.buffer   = tmp;
    tmp_stack.reserved = sz_tmp;
    tmp_stack.current  = -1;

    for (i = 0; i < sz_l; ++i)
    {
        MAFSA_letter label = l[i];
        stack_push(&tmp_stack, label);

        if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if ((i == sz_l && where) || 0 == l)
    {
        enumerate(ma, current, &tmp_stack, fetcher, user_data);
    }
}